

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::DumbDirectoryDatabase::~DumbDirectoryDatabase(DumbDirectoryDatabase *this)

{
  DumbDirectoryDatabase *local_18;
  DumbDirectoryDatabase *this_local;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__DumbDirectoryDatabase_00827990;
  local_18 = this + 1;
  do {
    local_18 = (DumbDirectoryDatabase *)(local_18[-1].seen_blobs + 9);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_18);
  } while (local_18 != (DumbDirectoryDatabase *)this->seen_blobs);
  std::__cxx11::string::~string((string *)&this->base_directory);
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

DumbDirectoryDatabase(const string &base, DatabaseMode mode_)
		: DatabaseInterface(mode_), base_directory(base), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
	}